

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-bind-error.c
# Opt level: O0

int run_test_tcp_bind_error_addrnotavail_1(void)

{
  int iVar1;
  undefined8 uVar2;
  uv_loop_t *loop;
  undefined1 local_110 [4];
  int r;
  uv_tcp_t server;
  sockaddr_in addr;
  
  iVar1 = uv_ip4_addr("127.255.255.255",0x23a3,&server.queued_fds);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-tcp-bind-error.c"
            ,0x76,"0 == uv_ip4_addr(\"127.255.255.255\", TEST_PORT, &addr)");
    abort();
  }
  uVar2 = uv_default_loop();
  iVar1 = uv_tcp_init(uVar2,local_110);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-tcp-bind-error.c"
            ,0x79,"r == 0");
    abort();
  }
  iVar1 = uv_tcp_bind(local_110,&server.queued_fds,0);
  if ((iVar1 != 0) && (iVar1 != -99)) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-tcp-bind-error.c"
            ,0x7d,"r == 0 || r == UV_EADDRNOTAVAIL");
    abort();
  }
  uv_close(local_110,close_cb);
  uVar2 = uv_default_loop();
  uv_run(uVar2,0);
  if (close_cb_called != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-tcp-bind-error.c"
            ,0x83,"close_cb_called == 1");
    abort();
  }
  loop = (uv_loop_t *)uv_default_loop();
  close_loop(loop);
  uVar2 = uv_default_loop();
  iVar1 = uv_loop_close(uVar2);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-tcp-bind-error.c"
            ,0x85,"0 == uv_loop_close(uv_default_loop())");
    abort();
  }
  uv_library_shutdown();
  return 0;
}

Assistant:

TEST_IMPL(tcp_bind_error_addrnotavail_1) {
  struct sockaddr_in addr;
  uv_tcp_t server;
  int r;

  ASSERT(0 == uv_ip4_addr("127.255.255.255", TEST_PORT, &addr));

  r = uv_tcp_init(uv_default_loop(), &server);
  ASSERT(r == 0);

  /* It seems that Linux is broken here - bind succeeds. */
  r = uv_tcp_bind(&server, (const struct sockaddr*) &addr, 0);
  ASSERT(r == 0 || r == UV_EADDRNOTAVAIL);

  uv_close((uv_handle_t*)&server, close_cb);

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT(close_cb_called == 1);

  MAKE_VALGRIND_HAPPY();
  return 0;
}